

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O0

span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
slang::ast::cloneArguments
          (Compilation *compilation,Scope *newParent,
          span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> source)

{
  bool bVar1;
  size_type sVar2;
  reference ppFVar3;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *in_RDI;
  FormalArgumentSymbol *copied;
  FormalArgumentSymbol *arg;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *__range2;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> arguments;
  ValueSymbol *in_stack_fffffffffffffee8;
  Scope *in_stack_fffffffffffffef0;
  FormalArgumentSymbol *in_stack_fffffffffffffef8;
  Expression *in_stack_ffffffffffffff00;
  DeclaredType *in_stack_ffffffffffffff08;
  not_null<const_slang::ast::DeclaredType_*> in_stack_ffffffffffffff10;
  DeclaredType *in_stack_ffffffffffffff18;
  not_null<slang::ast::DeclaredType_*> in_stack_ffffffffffffff20;
  FormalArgumentSymbol *this;
  __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
  local_88;
  undefined1 *local_80;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> local_70;
  EVP_PKEY_CTX *local_28;
  undefined1 local_20 [16];
  span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> local_10;
  
  local_28 = in_RDI;
  sVar2 = std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::size
                    ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
                     0x9c49f4);
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL>::SmallVector(&local_70,sVar2);
  local_80 = local_20;
  local_88._M_current =
       (FormalArgumentSymbol **)
       std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
                  in_stack_fffffffffffffee8);
  std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::end
            ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
             in_stack_fffffffffffffef8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffef0,
                       (__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffee8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppFVar3 = __gnu_cxx::
              __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
              ::operator*(&local_88);
    this = *ppFVar3;
    in_stack_fffffffffffffef8 =
         BumpAllocator::
         emplace<slang::ast::FormalArgumentSymbol,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,slang::ast::ArgumentDirection_const&,slang::ast::VariableLifetime_const&>
                   ((BumpAllocator *)in_stack_ffffffffffffff20.ptr,
                    (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff18,
                    (SourceLocation *)in_stack_ffffffffffffff10.ptr,
                    (ArgumentDirection *)in_stack_ffffffffffffff08,&in_stack_ffffffffffffff00->kind)
    ;
    (in_stack_fffffffffffffef8->super_VariableSymbol).flags.m_bits =
         (this->super_VariableSymbol).flags.m_bits;
    in_stack_ffffffffffffff20 = ValueSymbol::getDeclaredType(in_stack_fffffffffffffee8);
    in_stack_ffffffffffffff18 =
         not_null<slang::ast::DeclaredType_*>::operator->
                   ((not_null<slang::ast::DeclaredType_*> *)0x9c4afb);
    in_stack_ffffffffffffff10 = ValueSymbol::getDeclaredType(in_stack_fffffffffffffee8);
    in_stack_ffffffffffffff08 =
         not_null<const_slang::ast::DeclaredType_*>::operator*
                   ((not_null<const_slang::ast::DeclaredType_*> *)0x9c4b2a);
    DeclaredType::setLink(in_stack_ffffffffffffff18,in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff00 = FormalArgumentSymbol::getDefaultValue(this);
    FormalArgumentSymbol::setDefaultValue(in_stack_fffffffffffffef8,in_stack_ffffffffffffff00);
    Scope::addMember(in_stack_fffffffffffffef0,&in_stack_fffffffffffffee8->super_Symbol);
    SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::push_back
              ((SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *)
               in_stack_fffffffffffffef0,(FormalArgumentSymbol **)in_stack_fffffffffffffee8);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
    ::operator++(&local_88);
  }
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::copy
            (&local_70.super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>,local_28,src)
  ;
  std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::
  span<const_slang::ast::FormalArgumentSymbol_*,_18446744073709551615UL>
            ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
             in_stack_ffffffffffffff00,
             (span<const_slang::ast::FormalArgumentSymbol_*,_18446744073709551615UL> *)
             in_stack_fffffffffffffef8);
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> *)0x9c4c1a);
  return local_10;
}

Assistant:

static std::span<const FormalArgumentSymbol* const> cloneArguments(
    Compilation& compilation, Scope& newParent,
    std::span<const FormalArgumentSymbol* const> source) {

    SmallVector<const FormalArgumentSymbol*> arguments(source.size(), UninitializedTag());
    for (auto arg : source) {
        auto copied = compilation.emplace<FormalArgumentSymbol>(arg->name, arg->location,
                                                                arg->direction, arg->lifetime);
        copied->flags = arg->flags;
        copied->getDeclaredType()->setLink(*arg->getDeclaredType());
        copied->setDefaultValue(arg->getDefaultValue());

        newParent.addMember(*copied);
        arguments.push_back(copied);
    }

    return arguments.copy(compilation);
}